

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QString * __thiscall
QHash<ReplaceExtraCompilerCacheKey,_QString>::value
          (QString *__return_storage_ptr__,QHash<ReplaceExtraCompilerCacheKey,_QString> *this,
          ReplaceExtraCompilerCacheKey *key)

{
  QArrayDataPointer<char16_t> *other;
  
  other = &valueImpl<ReplaceExtraCompilerCacheKey>(this,key)->d;
  if (other == (QArrayDataPointer<char16_t> *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }